

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaKrylovDemo_ls.c
# Opt level: O0

void PrintHeader(sunrealtype rtol,sunrealtype atol,int linsolver)

{
  int in_EDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  printf("\nidaKrylovDemo_ls: Heat equation, serial example problem for IDA\n");
  printf("               Discretized heat equation on 2D unit square.\n");
  printf("               Zero boundary conditions,");
  printf(" polynomial initial conditions.\n");
  printf("         Mesh dimensions: %d x %d",10);
  printf("       Total system size: %d\n\n",100);
  printf("Tolerance parameters:  rtol = %g   atol = %g\n",in_XMM0_Qa,in_XMM1_Qa);
  printf("Constraints set to force all solution components >= 0. \n");
  if (in_EDI == 0) {
    printf("Linear solver: SPGMR, preconditioner using diagonal elements. \n");
  }
  else if (in_EDI == 1) {
    printf("Linear solver: SPBCG, preconditioner using diagonal elements. \n");
  }
  else if (in_EDI == 2) {
    printf("Linear solver: SPTFQMR, preconditioner using diagonal elements. \n");
  }
  return;
}

Assistant:

static void PrintHeader(sunrealtype rtol, sunrealtype atol, int linsolver)
{
  printf("\nidaKrylovDemo_ls: Heat equation, serial example problem for IDA\n");
  printf("               Discretized heat equation on 2D unit square.\n");
  printf("               Zero boundary conditions,");
  printf(" polynomial initial conditions.\n");
  printf("         Mesh dimensions: %d x %d", MGRID, MGRID);
  printf("       Total system size: %d\n\n", NEQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("Tolerance parameters:  rtol = %Lg   atol = %Lg\n", rtol, atol);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#else
  printf("Tolerance parameters:  rtol = %g   atol = %g\n", rtol, atol);
#endif
  printf("Constraints set to force all solution components >= 0. \n");

  switch (linsolver)
  {
  case (USE_SPGMR):
    printf("Linear solver: SPGMR, preconditioner using diagonal elements. \n");
    break;

  case (USE_SPBCG):
    printf("Linear solver: SPBCG, preconditioner using diagonal elements. \n");
    break;

  case (USE_SPTFQMR):
    printf(
      "Linear solver: SPTFQMR, preconditioner using diagonal elements. \n");
    break;
  }
}